

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,long,double>
                 (size_t col_num,size_t nrows,float *Xc,long *Xc_ind,long *Xc_indptr,
                 MissingAction missing_action,float *w)

{
  long lVar1;
  bool bVar2;
  long ix;
  long lVar3;
  long ix_1;
  long lVar4;
  double dVar5;
  double __z;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double local_98;
  double local_80;
  double local_78;
  
  lVar4 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  if (lVar4 != lVar1) {
    lVar3 = (nrows + lVar4) - lVar1;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    for (lVar3 = lVar4; lVar3 < lVar1; lVar3 = lVar3 + 1) {
      dVar9 = dVar9 + (double)w[Xc_ind[lVar3]];
    }
    if (0.0 < dVar9) {
      if (missing_action == Fail) {
        local_78 = 0.0;
        __z = 0.0;
        local_98 = 0.0;
        local_80 = 0.0;
        for (; lVar4 < lVar1; lVar4 = lVar4 + 1) {
          dVar5 = (double)w[Xc_ind[lVar4]];
          dVar6 = (double)Xc[lVar4];
          dVar8 = dVar6 * dVar6;
          local_80 = fma(dVar5,dVar6,local_80);
          local_98 = fma(dVar5,dVar8,local_98);
          local_78 = fma(dVar5,dVar6 * dVar8,local_78);
          __z = fma(dVar5,dVar8 * dVar8,__z);
        }
      }
      else {
        local_78 = 0.0;
        __z = 0.0;
        local_98 = 0.0;
        local_80 = 0.0;
        for (; lVar4 < lVar1; lVar4 = lVar4 + 1) {
          dVar5 = (double)w[Xc_ind[lVar4]];
          dVar6 = (double)Xc[lVar4];
          if ((NAN(Xc[lVar4])) || (ABS(dVar6) == INFINITY)) {
            dVar9 = dVar9 - dVar5;
          }
          else {
            dVar8 = dVar6 * dVar6;
            local_80 = fma(dVar5,dVar6,local_80);
            local_98 = fma(dVar5,dVar8,local_98);
            local_78 = fma(dVar5,dVar6 * dVar8,local_78);
            __z = fma(dVar5,dVar8 * dVar8,__z);
          }
        }
        if (dVar9 <= 0.0) {
          return -INFINITY;
        }
      }
      if ((1.0 < dVar9) && ((local_98 != 0.0 || (NAN(local_98))))) {
        if ((local_98 != local_80 * local_80) || (NAN(local_98) || NAN(local_80 * local_80))) {
          dVar8 = local_80 / dVar9;
          dVar6 = dVar8 * dVar8;
          dVar5 = local_98 / dVar9 - dVar6;
          if ((!NAN(dVar5)) &&
             (((2.220446049250313e-16 < dVar5 ||
               ((bVar2 = check_more_than_two_unique_values<float,long>
                                   (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), 0.0 < dVar5
                && (bVar2)))) &&
              (dVar9 = (dVar6 * dVar8 * dVar8 * dVar9 +
                       local_80 * -4.0 * dVar6 * dVar8 +
                       local_98 * 6.0 * dVar6 + local_78 * -4.0 * dVar8 + __z) /
                       (dVar5 * dVar5 * dVar9), (long)ABS(dVar9) < 0x7ff0000000000000)))) {
            if (dVar9 <= 0.0) {
              return 0.0;
            }
            return dVar9;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}